

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldscript.c
# Opt level: O1

int check_command(GlobalVars *gv,char *name,uint32_t flags)

{
  ScriptCmd *pSVar1;
  char *pcVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  ScriptCmd *pSVar6;
  bool bVar7;
  
  bVar7 = ldCommands[0].name == (char *)0x0;
  iVar4 = 0;
  if (!bVar7) {
    iVar4 = strcmp(ldCommands[0].name,name);
    pSVar6 = ldCommands;
    while (pcVar2 = scriptname, iVar4 != 0) {
      pSVar1 = pSVar6 + 1;
      bVar7 = pSVar1->name == (char *)0x0;
      if (bVar7) {
        return 0;
      }
      pSVar6 = pSVar6 + 1;
      iVar4 = strcmp(pSVar1->name,name);
    }
    iVar4 = 0;
    if (!bVar7) {
      if ((pSVar6->flags & flags) == 0) {
        if (-1 < (short)flags) {
          uVar5 = getlineno();
          error(0x6b,pcVar2,(ulong)uVar5,name);
        }
        if ((pSVar6->flags & 0x2000) != 0) {
          skipblock(0,'(',')');
        }
        iVar4 = 1;
        bVar3 = *(byte *)((long)&pSVar6->flags + 1) & 0x40;
        do {
          if (bVar3 == 0) {
            return 1;
          }
          bVar3 = getchr();
        } while (bVar3 != 0x3b);
      }
      else if (pSVar6->cmdptr == (_func_void_GlobalVars_ptr *)0x0) {
        uVar5 = getlineno();
        error(0x45,pcVar2,(ulong)uVar5,name);
        iVar4 = 1;
        if ((pSVar6->flags & 0x2000) != 0) {
          skipblock(0,'(',')');
        }
      }
      else {
        (*pSVar6->cmdptr)(gv);
        iVar4 = 1;
      }
    }
  }
  return iVar4;
}

Assistant:

static int check_command(struct GlobalVars *gv,char *name,uint32_t flags)
{
  struct ScriptCmd *scptr;

  for (scptr=ldCommands; scptr->name; scptr++) {
    if (!strcmp(scptr->name,name))
      break;
  }

  if (scptr->name) {
    if (scptr->flags & flags) {
      if (scptr->cmdptr) {
        scptr->cmdptr(gv);  /* execute linker-script command */
      }
      else {
        error(69,scriptname,getlineno(),name);  /* command ignored */
        if (scptr->flags & SCMDF_PAREN)
          skipblock(0,'(',')');
      }
    }
    else {
      if (!(flags & SCMDF_IGNORE)) {
        /* command not allowed outside SECTIONS block */
        error(107,scriptname,getlineno(),name);
      }
      if (scptr->flags & SCMDF_PAREN)
        skipblock(0,'(',')');
      if (scptr->flags & SCMDF_SEMIC)
        skip_expr(0);
    }
    return 1;
  }

  return 0;
}